

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O0

bool __thiscall QXcbSessionManager::allowsInteraction(QXcbSessionManager *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  QEventLoop eventLoop;
  ProcessEventsFlag in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte local_1d;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (sm_interactionActive) {
    local_1d = 1;
  }
  else if (sm_waitingForInteraction) {
    local_1d = 0;
  }
  else {
    if (sm_interactStyle == 2) {
      iVar1 = SmcInteractRequest(smcConnection,1,sm_interactCallback,in_RDI);
      sm_waitingForInteraction = iVar1 != 0;
    }
    if ((sm_waitingForInteraction & 1U) != 0) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QEventLoop::QEventLoop((QEventLoop *)&local_18,(QObject *)0x0);
      *(undefined8 **)(in_RDI + 0x70) = &local_18;
      QFlags<QEventLoop::ProcessEventsFlag>::QFlags
                ((QFlags<QEventLoop::ProcessEventsFlag> *)
                 CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      QEventLoop::exec((QFlags_conflict *)&local_18);
      *(undefined8 *)(in_RDI + 0x70) = 0;
      sm_waitingForInteraction = false;
      bVar2 = (sm_smActive & 1U) != 0;
      if (bVar2) {
        sm_interactionActive = true;
        qt_sm_blockUserInput = false;
        local_1d = 1;
      }
      QEventLoop::~QEventLoop((QEventLoop *)&local_18);
      if (bVar2) goto LAB_0020d159;
    }
    local_1d = 0;
  }
LAB_0020d159:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_1d & 1);
}

Assistant:

bool QXcbSessionManager::allowsInteraction()
{
    if (sm_interactionActive)
        return true;

    if (sm_waitingForInteraction)
        return false;

    if (sm_interactStyle == SmInteractStyleAny) {
        sm_waitingForInteraction = SmcInteractRequest(smcConnection,
                                                      SmDialogNormal,
                                                      sm_interactCallback,
                                                      (SmPointer*) this);
    }
    if (sm_waitingForInteraction) {
        QEventLoop eventLoop;
        m_eventLoop = &eventLoop;
        eventLoop.exec();
        m_eventLoop = nullptr;

        sm_waitingForInteraction = false;
        if (sm_smActive) { // not cancelled
            sm_interactionActive = true;
            qt_sm_blockUserInput = false;
            return true;
        }
    }
    return false;
}